

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg-buffer.c
# Opt level: O3

void msgbuf_drain(msgbuf *msgbuf,size_t n)

{
  ibuf *piVar1;
  ulong uVar2;
  ibuf *buf;
  
  buf = (msgbuf->bufs).tqh_first;
  if (n != 0 && buf != (ibuf *)0x0) {
    while( true ) {
      uVar2 = n + buf->rpos;
      n = uVar2 - buf->wpos;
      if (uVar2 < buf->wpos) break;
      piVar1 = (buf->entry).tqe_next;
      ibuf_dequeue(msgbuf,buf);
      if (piVar1 == (ibuf *)0x0) {
        return;
      }
      buf = piVar1;
      if (n == 0) {
        return;
      }
    }
    buf->rpos = uVar2;
  }
  return;
}

Assistant:

void
msgbuf_drain(struct msgbuf *msgbuf, size_t n)
{
	struct ibuf	*buf, *next;

	for (buf = TAILQ_FIRST(&msgbuf->bufs); buf != NULL && n > 0;
	    buf = next) {
		next = TAILQ_NEXT(buf, entry);
		if (buf->rpos + n >= buf->wpos) {
			n -= buf->wpos - buf->rpos;
			ibuf_dequeue(msgbuf, buf);
		} else {
			buf->rpos += n;
			n = 0;
		}
	}
}